

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wnorm
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  size_t sVar4;
  byte *pbVar5;
  long lVar6;
  byte *s_00;
  bool bVar7;
  gap g;
  gap local_48;
  
  local_48.end = (char_t *)0x0;
  local_48.size = 0;
  if (((anonymous_namespace)::chartype_table[(byte)*s] & 8) != 0) {
    local_48.size = 0;
    do {
      lVar6 = local_48.size + 1;
      local_48.size = local_48.size + 1;
    } while (((anonymous_namespace)::chartype_table[(byte)s[lVar6]] & 8) != 0);
    s = s + local_48.size;
    local_48.end = s;
  }
  do {
    sVar4 = local_48.size;
    s_00 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[(byte)*s] & 0xc) == 0) {
      if (((anonymous_namespace)::chartype_table[((byte *)s)[1]] & 0xc) != 0) {
        s_00 = (byte *)s + 1;
        goto LAB_0033198c;
      }
      if (((anonymous_namespace)::chartype_table[((byte *)s)[2]] & 0xc) != 0) {
        s_00 = (byte *)s + 2;
        goto LAB_0033198c;
      }
      bVar7 = ((anonymous_namespace)::chartype_table[((byte *)s)[3]] & 0xc) == 0;
      s_00 = (byte *)s + 4;
      if (!bVar7) {
        s_00 = (byte *)s + 3;
      }
    }
    else {
LAB_0033198c:
      bVar7 = false;
    }
    s = (char_t *)s_00;
    if (!bVar7) {
      bVar2 = *s_00;
      if (bVar2 == end_quote) {
        pbVar5 = s_00;
        if ((byte *)local_48.end != (byte *)0x0) {
          memmove(local_48.end + -local_48.size,local_48.end,(long)s_00 - (long)local_48.end);
          pbVar5 = s_00 + -sVar4;
        }
        do {
          *pbVar5 = 0;
          pbVar1 = pbVar5 + -1;
          pbVar5 = pbVar5 + -1;
        } while (((anonymous_namespace)::chartype_table[*pbVar1] & 8) != 0);
        return (char_t *)(s_00 + 1);
      }
      if (((anonymous_namespace)::chartype_table[bVar2] & 8) == 0) {
        if ((ulong)bVar2 == 0x26) {
          s = strconv_escape((char_t *)s_00,&local_48);
        }
        else {
          if (bVar2 == 0) {
            return (char_t *)0x0;
          }
          s = (char_t *)(s_00 + 1);
        }
      }
      else {
        s = (char_t *)(s_00 + 1);
        *s_00 = 0x20;
        if (((anonymous_namespace)::chartype_table[s_00[1]] & 8) != 0) {
          lVar6 = 0;
          do {
            lVar3 = lVar6 + 2;
            lVar6 = lVar6 + 1;
          } while (((anonymous_namespace)::chartype_table[s_00[lVar3]] & 8) != 0);
          if ((byte *)local_48.end != (byte *)0x0) {
            memmove(local_48.end + -local_48.size,local_48.end,(long)s - (long)local_48.end);
          }
          s = (char_t *)((byte *)s + lVar6);
          local_48.size = local_48.size + lVar6;
          local_48.end = s;
        }
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wnorm(char_t* s, char_t end_quote)
		{
			gap g;

			// trim leading whitespaces
			if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
			{
				char_t* str = s;

				do ++str;
				while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

				g.push(s, str - s);
			}

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws | ct_space));

				if (*s == end_quote)
				{
					char_t* str = g.flush(s);

					do *str-- = 0;
					while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					*s++ = ' ';

					if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
					{
						char_t* str = s + 1;
						while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space)) ++str;

						g.push(s, str - s);
					}
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}